

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JustInTime.hpp
# Opt level: O2

void __thiscall
JustInTimeActor<Atari::ST::Video,_HalfCycles,_1,_1>::update_sequence_point
          (JustInTimeActor<Atari::ST::Video,_HalfCycles,_1,_1> *this)

{
  HalfCycles HVar1;
  
  HVar1 = Atari::ST::Video::next_sequence_point(&this->object_);
  (this->time_until_event_).super_WrappedInt<HalfCycles>.length_ =
       (IntType)HVar1.super_WrappedInt<HalfCycles>.length_;
  if (0 < (long)HVar1.super_WrappedInt<HalfCycles>.length_) {
    return;
  }
  __assert_fail("time_until_event_ > LocalTimeScale(0)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Machines/Atari/ST/../../../ClockReceiver/JustInTime.hpp"
                ,0x102,
                "void JustInTimeActor<Atari::ST::Video>::update_sequence_point() [T = Atari::ST::Video, LocalTimeScale = HalfCycles, multiplier = 1, divider = 1]"
               );
}

Assistant:

void update_sequence_point() {
			if constexpr (has_sequence_points<T>::value) {
				// Keep a fast path where no conversions will be applied; if conversions are
				// going to be applied then do a direct max -> max translation rather than
				// allowing the arithmetic to overflow.
				if constexpr (divider == 1 && std::is_same_v<LocalTimeScale, TargetTimeScale>) {
					time_until_event_ = object_.next_sequence_point();
				} else {
					const auto time = object_.next_sequence_point();
					if(time == TargetTimeScale::max()) {
						time_until_event_ = LocalTimeScale::max();
					} else {
						time_until_event_ = time * divider;
					}
				}
				assert(time_until_event_ > LocalTimeScale(0));
			}
		}